

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int __thiscall glslang::TScanContext::identifierOrType(TScanContext *this)

{
  bool bVar1;
  int iVar2;
  TString *pTVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  ulong uVar6;
  TType *this_00;
  TVariable *variable;
  TScanContext *this_local;
  long *plVar5;
  
  pTVar3 = NewPoolTString_abi_cxx11_(this->tokenText);
  (this->parserToken->sType->lex).field_1.string = pTVar3;
  if ((this->field & 1U) == 0) {
    pTVar4 = TSymbolTable::find(this->parseContext->symbolTable,
                                (this->parserToken->sType->lex).field_1.string,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    (this->parserToken->sType->lex).symbol = pTVar4;
    if ((((this->afterType & 1U) == 0) && ((this->afterStruct & 1U) == 0)) &&
       ((this->parserToken->sType->lex).symbol != (TSymbol *)0x0)) {
      iVar2 = (*((this->parserToken->sType->lex).symbol)->_vptr_TSymbol[9])();
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      if ((plVar5 != (long *)0x0) && (uVar6 = (**(code **)(*plVar5 + 0xb0))(), (uVar6 & 1) != 0)) {
        this_00 = (TType *)(**(code **)(*plVar5 + 0x60))();
        bVar1 = TType::isReference(this_00);
        if ((!bVar1) || ((this->afterBuffer & 1U) == 0)) {
          this->afterType = true;
          return 0x28a;
        }
      }
    }
  }
  return 0x289;
}

Assistant:

int TScanContext::identifierOrType()
{
    parserToken->sType.lex.string = NewPoolTString(tokenText);
    if (field)
        return IDENTIFIER;

    parserToken->sType.lex.symbol = parseContext.symbolTable.find(*parserToken->sType.lex.string);
    if ((afterType == false && afterStruct == false) && parserToken->sType.lex.symbol != nullptr) {
        if (const TVariable* variable = parserToken->sType.lex.symbol->getAsVariable()) {
            if (variable->isUserType() &&
                // treat redeclaration of forward-declared buffer/uniform reference as an identifier
                !(variable->getType().isReference() && afterBuffer)) {
                afterType = true;

                return TYPE_NAME;
            }
        }
    }

    return IDENTIFIER;
}